

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::StandardColumnWriter<long,_long,_duckdb::ParquetTimestampNSOperator>::
WriteVectorInternal<false>
          (StandardColumnWriter<long,_long,_duckdb::ParquetTimestampNSOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  ValidityMask *mask;
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  idx_t i;
  Allocator *pAVar3;
  long lVar4;
  idx_t iVar5;
  primitive_dictionary_entry_t *ppVar6;
  InternalException *this_00;
  NumericStatisticsState<long,_long,_duckdb::BaseParquetOperator> *numeric_stats;
  WriteStream *ser;
  long *value;
  idx_t r;
  idx_t iVar7;
  long target_value;
  string local_58;
  StandardColumnWriter<long,_long,_duckdb::ParquetTimestampNSOperator> *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_38 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_01d12de3_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Unknown encoding","");
    InternalException::InternalException(this_00,&local_58);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  mask = &input_column->validity;
  pdVar1 = input_column->data;
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
      TemplatedWritePlain<long,long,duckdb::ParquetTimestampNSOperator,true>
                (input_column,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<long,long,duckdb::ParquetTimestampNSOperator,false>
              (input_column,stats,chunk_start,chunk_end,mask,temp_writer);
    return;
  default:
    goto switchD_01d12de3_caseD_1;
  case 5:
    iVar7 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar5 = chunk_start;
      do {
        iVar7 = chunk_start;
        if ((puVar2 == (unsigned_long *)0x0) ||
           (iVar7 = iVar5, (puVar2[iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = *(pointer *)(pdVar1 + iVar7 * 8);
          if ((long)local_58._M_dataplus._M_p < (long)stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = (_func_int **)local_58._M_dataplus._M_p;
          }
          if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)local_58._M_dataplus._M_p) {
            stats[2]._vptr_ColumnWriterStatistics = (_func_int **)local_58._M_dataplus._M_p;
          }
          DbpEncoder::BeginWriteInternal
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(int64_t *)&local_58);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          iVar7 = iVar7 + 1;
          break;
        }
        iVar5 = iVar5 + 1;
        iVar7 = chunk_end;
      } while (chunk_end != iVar5);
    }
    if (iVar7 < chunk_end) {
      do {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = *(pointer *)(pdVar1 + iVar7 * 8);
          if ((long)local_58._M_dataplus._M_p < (long)stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = (_func_int **)local_58._M_dataplus._M_p;
          }
          if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)local_58._M_dataplus._M_p) {
            stats[2]._vptr_ColumnWriterStatistics = (_func_int **)local_58._M_dataplus._M_p;
          }
          DbpEncoder::WriteValueInternal
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(int64_t *)&local_58);
        }
        iVar7 = iVar7 + 1;
      } while (chunk_end != iVar7);
    }
    break;
  case 6:
    iVar7 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar5 = chunk_start;
      do {
        iVar7 = chunk_start;
        if ((puVar2 == (unsigned_long *)0x0) ||
           (iVar7 = iVar5, (puVar2[iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = *(pointer *)(pdVar1 + iVar7 * 8);
          if ((long)local_58._M_dataplus._M_p < (long)stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = (_func_int **)local_58._M_dataplus._M_p;
          }
          if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)local_58._M_dataplus._M_p) {
            stats[2]._vptr_ColumnWriterStatistics = (_func_int **)local_58._M_dataplus._M_p;
          }
          pAVar3 = BufferAllocator::Get
                             (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<long>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar3,temp_writer,(long *)&local_58);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          iVar7 = iVar7 + 1;
          break;
        }
        iVar5 = iVar5 + 1;
        iVar7 = chunk_end;
      } while (chunk_end != iVar5);
    }
    if (iVar7 < chunk_end) {
      do {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = *(pointer *)(pdVar1 + iVar7 * 8);
          if ((long)local_58._M_dataplus._M_p < (long)stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = (_func_int **)local_58._M_dataplus._M_p;
          }
          if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)local_58._M_dataplus._M_p) {
            stats[2]._vptr_ColumnWriterStatistics = (_func_int **)local_58._M_dataplus._M_p;
          }
          DlbaEncoder::WriteValue<long>
                    ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,(long *)&local_58);
        }
        iVar7 = iVar7 + 1;
      } while (chunk_end != iVar7);
    }
    break;
  case 8:
    iVar7 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar5 = chunk_start;
      do {
        iVar7 = chunk_start;
        if ((puVar2 == (unsigned_long *)0x0) ||
           (iVar7 = iVar5, (puVar2[iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p._0_1_ =
               *(undefined1 *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
          (**temp_writer->_vptr_WriteStream)(temp_writer,&local_58,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          break;
        }
        iVar5 = iVar5 + 1;
        iVar7 = chunk_end;
      } while (chunk_end != iVar5);
    }
    if (iVar7 < chunk_end) {
      value = (long *)(pdVar1 + iVar7 * 8);
      do {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)) {
          ppVar6 = PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampNSOperator>::Lookup
                             ((PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampNSOperator> *
                              )page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
          local_58._M_dataplus._M_p._0_4_ = ppVar6->index;
          RleBpEncoder::WriteValue
                    ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&local_58);
        }
        iVar7 = iVar7 + 1;
        value = value + 1;
      } while (chunk_end != iVar7);
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar3 = BufferAllocator::Get
                         (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar3);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar2 == (unsigned_long *)0x0) ||
           ((puVar2[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p = *(pointer *)(pdVar1 + chunk_start * 8);
          if ((long)local_58._M_dataplus._M_p < (long)stats[1]._vptr_ColumnWriterStatistics) {
            stats[1]._vptr_ColumnWriterStatistics = (_func_int **)local_58._M_dataplus._M_p;
          }
          if ((long)stats[2]._vptr_ColumnWriterStatistics < (long)local_58._M_dataplus._M_p) {
            stats[2]._vptr_ColumnWriterStatistics = (_func_int **)local_58._M_dataplus._M_p;
          }
          lVar4 = 0;
          do {
            *(undefined1 *)
             ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
             (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar4 +
                   (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) =
                 *(undefined1 *)((long)&local_58._M_dataplus._M_p + lVar4);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 8);
          page_state_p[0x1217]._vptr_ColumnWriterPageState =
               (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        }
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}